

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_plot.cc
# Opt level: O3

int main(void)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  double dVar4;
  char local_59;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  iVar3 = 200;
  do {
    iVar1 = rand();
    local_58 = (double)iVar1 * 4.656612873077393e-10;
    iVar1 = rand();
    local_50 = (double)iVar1 * 4.656612873077393e-10;
    local_58 = local_58 * 6.283185307179586;
    local_30 = cos(local_58);
    local_48 = (1.0 - local_50) * local_50;
    dVar4 = SQRT(local_48);
    local_38 = dVar4;
    if (local_48 < 0.0) {
      dVar4 = sqrt(local_48);
    }
    local_40 = dVar4;
    local_58 = sin(local_58);
    dVar4 = local_38;
    if (local_48 < 0.0) {
      dVar4 = sqrt(local_48);
    }
    local_58 = (local_58 + local_58) * dVar4;
    local_50 = 1.0 - (local_50 + local_50);
    poVar2 = std::ostream::_M_insert<double>((local_30 + local_30) * local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    poVar2 = std::ostream::_M_insert<double>(local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    poVar2 = std::ostream::_M_insert<double>(local_50);
    local_59 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_59,1);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return 0;
}

Assistant:

int main() {
    for (int i = 0; i < 200; i++) {
        auto r1 = random_double();
        auto r2 = random_double();
        auto x = std::cos(2*pi*r1) * 2 * std::sqrt(r2*(1-r2));
        auto y = std::sin(2*pi*r1) * 2 * std::sqrt(r2*(1-r2));
        auto z = 1 - 2*r2;
        std::cout << x << " " << y << " " << z << '\n';
    }
}